

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O3

void highbd_bilinear_filter
               (uint16_t *src,int src_stride,int xoffset,int yoffset,uint16_t *dst,int w,int h)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  undefined8 uVar3;
  uint uVar4;
  uint16_t *puVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar29 [16];
  undefined1 auVar25 [16];
  undefined1 auVar30 [16];
  undefined1 auVar26 [16];
  undefined1 auVar31 [16];
  
  if (xoffset == 0) {
    if (-1 < h) {
      puVar5 = dst;
      iVar6 = 0;
      do {
        if (0 < w) {
          lVar7 = 0;
          do {
            uVar3 = *(undefined8 *)(src + lVar7 + 4);
            *(undefined8 *)(puVar5 + lVar7) = *(undefined8 *)(src + lVar7);
            *(undefined8 *)(puVar5 + lVar7 + 4) = uVar3;
            lVar7 = lVar7 + 8;
          } while (lVar7 < w);
        }
        puVar5 = puVar5 + (uint)w;
        src = src + src_stride;
        bVar8 = iVar6 != h;
        iVar6 = iVar6 + 1;
      } while (bVar8);
    }
  }
  else if (xoffset == 4) {
    if (-1 < h) {
      puVar5 = dst;
      iVar6 = 0;
      do {
        if (0 < w) {
          lVar7 = 0;
          do {
            puVar1 = src + lVar7;
            uVar9 = pavgw(puVar1[1],*puVar1);
            uVar10 = pavgw(puVar1[2],puVar1[1]);
            uVar11 = pavgw(puVar1[3],puVar1[2]);
            uVar12 = pavgw(puVar1[4],puVar1[3]);
            uVar13 = pavgw(puVar1[5],puVar1[4]);
            uVar14 = pavgw(puVar1[6],puVar1[5]);
            uVar15 = pavgw(puVar1[7],puVar1[6]);
            uVar16 = pavgw(src[lVar7 + 8],puVar1[7]);
            puVar1 = puVar5 + lVar7;
            *puVar1 = uVar9;
            puVar1[1] = uVar10;
            puVar1[2] = uVar11;
            puVar1[3] = uVar12;
            puVar1[4] = uVar13;
            puVar1[5] = uVar14;
            puVar1[6] = uVar15;
            puVar1[7] = uVar16;
            lVar7 = lVar7 + 8;
          } while (lVar7 < w);
        }
        puVar5 = puVar5 + (uint)w;
        src = src + src_stride;
        bVar8 = iVar6 != h;
        iVar6 = iVar6 + 1;
      } while (bVar8);
    }
  }
  else if (-1 < h) {
    uVar4 = (uint)bilinear_filters_2t[xoffset][0] | (uint)bilinear_filters_2t[xoffset][1] << 0x10;
    auVar20._4_4_ = uVar4;
    auVar20._0_4_ = uVar4;
    auVar20._8_4_ = uVar4;
    auVar20._12_4_ = uVar4;
    puVar5 = dst;
    iVar6 = 0;
    do {
      if (0 < w) {
        lVar7 = 0;
        do {
          auVar17 = *(undefined1 (*) [16])(src + lVar7);
          auVar26._0_12_ = auVar17._0_12_;
          auVar26._12_2_ = auVar17._6_2_;
          auVar26._14_2_ = auVar17._8_2_;
          auVar25._12_4_ = auVar26._12_4_;
          auVar25._0_10_ = auVar17._0_10_;
          auVar25._10_2_ = auVar17._6_2_;
          auVar24._10_6_ = auVar25._10_6_;
          auVar24._0_8_ = auVar17._0_8_;
          auVar24._8_2_ = auVar17._4_2_;
          auVar23._8_8_ = auVar24._8_8_;
          auVar23._6_2_ = auVar17._4_2_;
          auVar22._0_4_ = auVar17._0_4_;
          auVar23._4_2_ = auVar17._2_2_;
          auVar23._0_4_ = auVar22._0_4_;
          auVar22._4_12_ = auVar23._4_12_;
          auVar32 = pmaddwd(auVar22,auVar20);
          auVar27._0_4_ = auVar32._0_4_ + 0x40U >> 7;
          auVar27._4_4_ = auVar32._4_4_ + 0x40U >> 7;
          auVar27._8_4_ = auVar32._8_4_ + 0x40U >> 7;
          auVar27._12_4_ = auVar32._12_4_ + 0x40U >> 7;
          auVar32._0_4_ = auVar17._8_4_;
          auVar32._4_2_ = auVar17._10_2_;
          auVar32._6_2_ = auVar17._12_2_;
          auVar32._8_2_ = auVar17._12_2_;
          auVar32._10_2_ = auVar17._14_2_;
          auVar32._12_2_ = auVar17._14_2_;
          auVar32._14_2_ = src[lVar7 + 8];
          auVar17 = pmaddwd(auVar32,auVar20);
          auVar18._0_4_ = auVar17._0_4_ + 0x40U >> 7;
          auVar18._4_4_ = auVar17._4_4_ + 0x40U >> 7;
          auVar18._8_4_ = auVar17._8_4_ + 0x40U >> 7;
          auVar18._12_4_ = auVar17._12_4_ + 0x40U >> 7;
          auVar17 = packssdw(auVar27,auVar18);
          *(undefined1 (*) [16])(puVar5 + lVar7) = auVar17;
          lVar7 = lVar7 + 8;
        } while (lVar7 < w);
      }
      puVar5 = puVar5 + (uint)w;
      src = src + src_stride;
      bVar8 = iVar6 != h;
      iVar6 = iVar6 + 1;
    } while (bVar8);
  }
  if (yoffset != 0) {
    if (yoffset == 4) {
      if (0 < h) {
        puVar5 = dst + (uint)w;
        iVar6 = 0;
        do {
          if (0 < w) {
            lVar7 = 0;
            do {
              puVar1 = dst + lVar7;
              puVar2 = puVar5 + lVar7;
              uVar9 = pavgw(*puVar2,*puVar1);
              uVar10 = pavgw(puVar2[1],puVar1[1]);
              uVar11 = pavgw(puVar2[2],puVar1[2]);
              uVar12 = pavgw(puVar2[3],puVar1[3]);
              uVar13 = pavgw(puVar2[4],puVar1[4]);
              uVar14 = pavgw(puVar2[5],puVar1[5]);
              uVar15 = pavgw(puVar2[6],puVar1[6]);
              uVar16 = pavgw(puVar2[7],puVar1[7]);
              puVar1 = dst + lVar7;
              *puVar1 = uVar9;
              puVar1[1] = uVar10;
              puVar1[2] = uVar11;
              puVar1[3] = uVar12;
              puVar1[4] = uVar13;
              puVar1[5] = uVar14;
              puVar1[6] = uVar15;
              puVar1[7] = uVar16;
              lVar7 = lVar7 + 8;
            } while (lVar7 < w);
          }
          iVar6 = iVar6 + 1;
          puVar5 = puVar5 + (uint)w;
          dst = dst + (uint)w;
        } while (iVar6 != h);
      }
    }
    else if (0 < h) {
      uVar4 = (uint)bilinear_filters_2t[yoffset][0] | (uint)bilinear_filters_2t[yoffset][1] << 0x10;
      auVar17._4_4_ = uVar4;
      auVar17._0_4_ = uVar4;
      auVar17._8_4_ = uVar4;
      auVar17._12_4_ = uVar4;
      puVar5 = dst + (uint)w;
      iVar6 = 0;
      do {
        if (0 < w) {
          lVar7 = 0;
          do {
            auVar20 = *(undefined1 (*) [16])(dst + lVar7);
            puVar1 = puVar5 + lVar7;
            auVar31._0_12_ = auVar20._0_12_;
            auVar31._12_2_ = auVar20._6_2_;
            auVar31._14_2_ = puVar1[3];
            auVar30._12_4_ = auVar31._12_4_;
            auVar30._0_10_ = auVar20._0_10_;
            auVar30._10_2_ = puVar1[2];
            auVar29._10_6_ = auVar30._10_6_;
            auVar29._0_8_ = auVar20._0_8_;
            auVar29._8_2_ = auVar20._4_2_;
            auVar28._8_8_ = auVar29._8_8_;
            auVar28._6_2_ = puVar1[1];
            auVar28._4_2_ = auVar20._2_2_;
            auVar28._0_2_ = auVar20._0_2_;
            auVar28._2_2_ = *puVar1;
            auVar32 = pmaddwd(auVar28,auVar17);
            auVar33._0_4_ = auVar32._0_4_ + 0x40U >> 7;
            auVar33._4_4_ = auVar32._4_4_ + 0x40U >> 7;
            auVar33._8_4_ = auVar32._8_4_ + 0x40U >> 7;
            auVar33._12_4_ = auVar32._12_4_ + 0x40U >> 7;
            auVar19._2_2_ = puVar1[4];
            auVar19._0_2_ = auVar20._8_2_;
            auVar19._4_2_ = auVar20._10_2_;
            auVar19._6_2_ = puVar1[5];
            auVar19._8_2_ = auVar20._12_2_;
            auVar19._10_2_ = puVar1[6];
            auVar19._12_2_ = auVar20._14_2_;
            auVar19._14_2_ = puVar1[7];
            auVar20 = pmaddwd(auVar19,auVar17);
            auVar21._0_4_ = auVar20._0_4_ + 0x40U >> 7;
            auVar21._4_4_ = auVar20._4_4_ + 0x40U >> 7;
            auVar21._8_4_ = auVar20._8_4_ + 0x40U >> 7;
            auVar21._12_4_ = auVar20._12_4_ + 0x40U >> 7;
            auVar20 = packssdw(auVar33,auVar21);
            *(undefined1 (*) [16])(dst + lVar7) = auVar20;
            lVar7 = lVar7 + 8;
          } while (lVar7 < w);
        }
        iVar6 = iVar6 + 1;
        puVar5 = puVar5 + (uint)w;
        dst = dst + (uint)w;
      } while (iVar6 != h);
    }
  }
  return;
}

Assistant:

static void highbd_bilinear_filter(const uint16_t *src, int src_stride,
                                   int xoffset, int yoffset, uint16_t *dst,
                                   int w, int h) {
  int i, j;
  // Horizontal filter
  if (xoffset == 0) {
    uint16_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 8) {
        __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        _mm_storeu_si128((__m128i *)&b[j], x);
      }
      src += src_stride;
      b += w;
    }
  } else if (xoffset == 4) {
    uint16_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 8) {
        __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        __m128i y = _mm_loadu_si128((__m128i *)&src[j + 8]);
        __m128i z = _mm_alignr_epi8(y, x, 2);
        _mm_storeu_si128((__m128i *)&b[j], _mm_avg_epu16(x, z));
      }
      src += src_stride;
      b += w;
    }
  } else {
    uint16_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi32(hfilter[0] | (hfilter[1] << 16));
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        const __m128i y = _mm_loadu_si128((__m128i *)&src[j + 8]);
        const __m128i z = _mm_alignr_epi8(y, x, 2);
        const __m128i res = highbd_filter_block(x, z, hfilter_vec);
        _mm_storeu_si128((__m128i *)&b[j], res);
      }

      src += src_stride;
      b += w;
    }
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        __m128i x = _mm_loadu_si128((__m128i *)&dst[j]);
        __m128i y = _mm_loadu_si128((__m128i *)&dst[j + w]);
        _mm_storeu_si128((__m128i *)&dst[j], _mm_avg_epu16(x, y));
      }
      dst += w;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi32(vfilter[0] | (vfilter[1] << 16));
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i x = _mm_loadu_si128((__m128i *)&dst[j]);
        const __m128i y = _mm_loadu_si128((__m128i *)&dst[j + w]);
        const __m128i res = highbd_filter_block(x, y, vfilter_vec);
        _mm_storeu_si128((__m128i *)&dst[j], res);
      }

      dst += w;
    }
  }
}